

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O1

void generate_info_set(MppBufSlotsImpl *impl,MppFrame frame,RK_U32 force_def_align)

{
  MppFrame pvVar1;
  ulong uVar2;
  MppFrame s;
  RK_U32 RVar3;
  RK_U32 RVar4;
  uint uVar5;
  uint uVar6;
  RK_U32 RVar7;
  MPP_RET MVar8;
  size_t v;
  MppFrameFormat MVar9;
  uint uVar10;
  char *fmt;
  int iVar11;
  RK_U32 RVar12;
  MppBufSlotsImpl *pMVar13;
  RK_U32 RVar14;
  ulong uVar15;
  ulong uVar16;
  MppSysCfg cfg;
  MppBufSlotInfoSet sys_cfg_info_set;
  MppSysCfg local_88;
  ulong local_80;
  RK_U32 local_78;
  RK_U32 local_74;
  RK_U32 local_70;
  uint local_6c;
  MppFrameFormat local_68;
  MppFrameFormat local_64;
  ulong local_60;
  RK_U32 local_54;
  RK_U32 local_50;
  RK_U32 local_4c;
  ulong local_48;
  MppBufSlotsImpl *local_40;
  MppFrame local_38;
  
  local_60 = CONCAT44(local_60._4_4_,force_def_align);
  local_50 = mpp_frame_get_width(frame);
  local_4c = mpp_frame_get_height(frame);
  local_64 = mpp_frame_get_fmt(frame);
  RVar3 = mpp_frame_get_width(frame);
  RVar4 = mpp_frame_get_height(frame);
  local_68 = mpp_frame_get_fmt(frame);
  MVar9 = local_68 & 0xfffff;
  local_80 = (ulong)MVar9;
  iVar11 = 10;
  if ((MVar9 | MPP_FMT_YUV422SP) != MPP_FMT_YUV422SP_10BIT) {
    iVar11 = (uint)(MVar9 == MPP_FMT_YUV444SP_10BIT) * 2 + 8;
  }
  uVar5 = mpp_frame_get_hor_stride(frame);
  local_38 = frame;
  uVar6 = mpp_frame_get_ver_stride(frame);
  RVar7 = RVar3;
  if (impl->hal_width_align != (AlignFunc)0x0) {
    RVar7 = (*impl->hal_width_align)(RVar3);
  }
  uVar10 = RVar7 * iVar11 >> 3;
  if (uVar5 != 0) {
    uVar10 = uVar5;
  }
  RVar7 = (*impl->hal_hor_align)(uVar10);
  if (uVar5 == 0) {
    uVar5 = RVar7;
  }
  if (uVar6 != 0) {
    RVar4 = uVar6;
  }
  local_40 = impl;
  RVar4 = (*impl->hal_ver_align)(RVar4);
  s = local_38;
  pMVar13 = local_40;
  if (uVar6 == 0) {
    uVar6 = RVar4;
  }
  if ((int)local_60 == 0) {
    uVar6 = RVar4;
    uVar5 = RVar7;
  }
  local_60 = (ulong)uVar6;
  if ((local_68 & 0xf00000) != MPP_FMT_YUV420SP) {
    if (*compat_ext_fbc_hdr_256_odd == 0) {
      uVar5 = RVar3 + 0x3f & 0xffffffc0;
    }
    else {
      uVar5 = RVar3 + 0xff & 0xfffffe00 | 0x100;
    }
    uVar5 = iVar11 * uVar5 >> 3;
  }
  local_48 = (ulong)uVar5;
  uVar10 = (uint)local_80;
  if (uVar10 < 0x12) {
    if ((0x2000aU >> (uVar10 & 0x1f) & 1) == 0) {
      if ((0x300U >> (uVar10 & 0x1f) & 1) == 0) goto LAB_0012fb79;
      goto LAB_0012fba5;
    }
    uVar15 = (ulong)(uVar5 * 8) / 10;
  }
  else {
LAB_0012fb79:
    if (uVar10 - 0x10000 < 2) {
LAB_0012fba5:
      uVar15 = (ulong)(uVar5 >> 1);
    }
    else {
      uVar15 = local_48;
      if (uVar10 - 0x10006 < 2) {
        uVar15 = local_48 / 3;
      }
    }
  }
  RVar4 = uVar5 * uVar6;
  if ((local_68 & 0xf00000) == MPP_FMT_YUV420SP) {
    if (local_40->hal_len_align == (AlignFunc)0x0) {
      RVar4 = (RVar4 * local_40->numerator) / local_40->denominator;
    }
    else {
      RVar4 = (*local_40->hal_len_align)(RVar4);
    }
    local_80 = CONCAT44(local_80._4_4_,RVar4);
  }
  else {
    uVar5 = (int)uVar15 + 0x3fU & 0xffffffc0;
    uVar15 = (ulong)uVar5;
    switch(local_80 & 0xffffffff) {
    case 0:
      uVar5 = (uVar6 + 0xf & 0xfffffff0) * uVar5;
      iVar11 = ((int)uVar5 >> 8) * 3;
      break;
    case 1:
    case 2:
      iVar11 = (uVar6 + 0xf & 0xfffffff0) * uVar5;
      uVar5 = (iVar11 >> 4) + iVar11 * 2;
      goto LAB_0012fcab;
    case 3:
      uVar5 = (uVar6 + 0xf & 0xfffffff0) * uVar5;
      iVar11 = ((int)uVar5 >> 8) * 5;
      break;
    default:
      if (uVar10 != 0xf) {
        if (uVar10 == 0x11) {
          iVar11 = (uVar6 + 0xf & 0xfffffff0) * uVar5;
          uVar5 = (iVar11 >> 4) + iVar11 * 4;
        }
        else {
          uVar5 = RVar4 * 3 >> 1;
          _mpp_log_l(2,"mpp_buf_slot","dec out fmt is no support",(char *)0x0);
        }
        goto LAB_0012fcab;
      }
      uVar5 = (uVar6 + 0xf & 0xfffffff0) * uVar5;
      iVar11 = (uVar5 >> 8) * 0x300;
      goto LAB_0012fca9;
    }
    iVar11 = iVar11 << 7;
LAB_0012fca9:
    uVar5 = iVar11 + ((int)uVar5 >> 4);
LAB_0012fcab:
    local_80 = CONCAT44(local_80._4_4_,uVar5);
    mpp_frame_set_fbc_size(s,(long)(int)uVar5);
  }
  RVar4 = mpp_frame_get_width(s);
  local_54 = mpp_frame_get_height(s);
  local_68 = mpp_frame_get_hor_stride(s);
  RVar3 = mpp_frame_get_ver_stride(s);
  MVar9 = mpp_frame_get_fmt(s);
  MVar8 = mpp_sys_cfg_get(&local_88);
  if (MVar8 == MPP_OK) {
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:enable",1);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:type",pMVar13->coding_type);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_codec",MVar9 & 0xfffff);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_fbc",MVar9 & 0xf00000);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:fmt_hdr",MVar9 & 0xc000000);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:width",RVar4);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:height",local_54);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:h_stride_by_byte",local_68);
    mpp_sys_cfg_set_u32(local_88,"dec_buf_chk:v_stride",RVar3);
    mpp_sys_cfg_ioctl(local_88);
    pMVar13 = local_40;
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:h_stride_by_byte",&local_74);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:h_stride_by_pixel",&local_78);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:v_stride",&local_70);
    mpp_sys_cfg_get_u32(local_88,"dec_buf_chk:size_total",&local_6c);
    MVar8 = mpp_sys_cfg_put(local_88);
    uVar16 = local_48;
    if (MVar8 != MPP_OK) {
      fmt = "mpp_sys_cfg_put failed\n";
      goto LAB_0012fe49;
    }
  }
  else {
    fmt = "mpp_sys_cfg_get failed\n";
LAB_0012fe49:
    uVar16 = local_48;
    _mpp_log_l(2,"mpp_buf_slot",fmt,(char *)0x0);
  }
  mpp_frame_set_width(pMVar13->info_set,local_50);
  mpp_frame_set_height(pMVar13->info_set,local_4c);
  mpp_frame_set_fmt(pMVar13->info_set,local_64);
  RVar4 = use_legacy_align;
  RVar7 = (RK_U32)uVar16;
  RVar3 = RVar7;
  if (use_legacy_align == 0) {
    RVar3 = local_74;
  }
  mpp_frame_set_hor_stride(pMVar13->info_set,RVar3);
  RVar3 = (RK_U32)local_60;
  if (RVar4 == 0) {
    RVar3 = local_70;
  }
  mpp_frame_set_ver_stride(pMVar13->info_set,RVar3);
  RVar14 = (RK_U32)uVar15;
  RVar3 = RVar14;
  if (RVar4 == 0) {
    RVar3 = local_78;
  }
  mpp_frame_set_hor_stride_pixel(pMVar13->info_set,RVar3);
  uVar6 = (uint)local_80;
  uVar5 = local_6c;
  if (RVar4 != 0) {
    uVar5 = (uint)local_80;
  }
  mpp_frame_set_buf_size(pMVar13->info_set,(ulong)uVar5);
  uVar5 = local_6c;
  if (RVar4 != 0) {
    uVar5 = uVar6;
  }
  mpp_frame_set_buf_size(s,(ulong)uVar5);
  RVar3 = RVar7;
  if (RVar4 == 0) {
    RVar3 = local_74;
  }
  mpp_frame_set_hor_stride(s,RVar3);
  uVar2 = local_60;
  RVar12 = (RK_U32)local_60;
  RVar3 = RVar12;
  if (RVar4 == 0) {
    RVar3 = local_70;
  }
  mpp_frame_set_ver_stride(s,RVar3);
  RVar3 = RVar14;
  if (RVar4 == 0) {
    RVar3 = local_78;
  }
  mpp_frame_set_hor_stride_pixel(s,RVar3);
  uVar6 = (uint)local_80;
  uVar5 = local_6c;
  if (RVar4 != 0) {
    uVar5 = (uint)local_80;
  }
  pMVar13->buf_size = (ulong)uVar5;
  RVar4 = mpp_frame_get_thumbnail_en(s);
  if (RVar4 != 1) goto LAB_0013000e;
  RVar4 = mpp_frame_get_height(s);
  RVar3 = mpp_frame_get_width(s);
  uVar5 = ((RVar3 >> 1) + 0xf & 0xffffff0) * ((RVar4 >> 1) + 0xf & 0xfffffff0);
  MVar9 = local_64 & 0xfffff;
  uVar6 = (uint)local_80;
  if (MVar9 < MPP_FMT_YUV400) {
    if (MVar9 < MPP_FMT_YUV422SP) {
      uVar5 = uVar5 * 3 >> 1;
    }
    else if (MVar9 - MPP_FMT_YUV422SP < 2) {
      uVar5 = uVar5 * 2;
    }
    else {
LAB_0012ffe0:
      uVar5 = uVar5 * 3 >> 1;
    }
  }
  else if (MVar9 != MPP_FMT_YUV400) {
    if ((MVar9 != MPP_FMT_YUV444SP) && (MVar9 != MPP_FMT_YUV444SP_10BIT)) goto LAB_0012ffe0;
    uVar5 = uVar5 * 3;
  }
  v = (ulong)uVar5 + pMVar13->buf_size;
  pMVar13->buf_size = v;
  mpp_frame_set_buf_size(pMVar13->info_set,v);
  mpp_frame_set_buf_size(s,pMVar13->buf_size);
LAB_0013000e:
  pvVar1 = pMVar13->info_set;
  *(undefined4 *)((long)pvVar1 + 0x54) = *(undefined4 *)((long)s + 0x54);
  *(undefined4 *)((long)pvVar1 + 0x58) = *(undefined4 *)((long)s + 0x58);
  *(undefined4 *)((long)pvVar1 + 0x5c) = *(undefined4 *)((long)s + 0x5c);
  *(undefined4 *)((long)pvVar1 + 0x60) = *(undefined4 *)((long)s + 0x60);
  *(undefined4 *)((long)pvVar1 + 100) = *(undefined4 *)((long)s + 100);
  if (pMVar13->align_chk_log_en != 0) {
    pMVar13->align_chk_log_en = 0;
    if (RVar14 != local_78) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_pixel %d - %d\n",(char *)0x0,uVar15);
    }
    if (RVar7 != local_74) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch h_stride_by_byte %d - %d\n",(char *)0x0,
                 uVar16 & 0xffffffff);
    }
    if (RVar12 != local_70) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch v_stride %d - %d\n",(char *)0x0,uVar2 & 0xffffffff);
    }
    if (uVar6 != local_6c) {
      _mpp_log_l(4,"mpp_buf_slot","mismatch size_total %d - %d\n",(char *)0x0,(ulong)uVar6);
    }
  }
  return;
}

Assistant:

static void generate_info_set(MppBufSlotsImpl *impl, MppFrame frame, RK_U32 force_def_align)
{
    const RK_U32 width  = mpp_frame_get_width(frame);
    const RK_U32 height = mpp_frame_get_height(frame);
    const MppFrameFormat fmt = mpp_frame_get_fmt(frame);
    MppBufSlotInfoSet legacy_info_set;
    MppBufSlotInfoSet sys_cfg_info_set;
    MppBufSlotInfoSet *info_set_ptr = NULL;
    MppFrameImpl *info_set_impl = NULL;
    MppFrameImpl *frame_impl = NULL;

    prepare_info_set_legacy(impl, frame, &legacy_info_set, force_def_align);
    prepare_info_set_by_sys_cfg(impl, frame, &sys_cfg_info_set);

    mpp_frame_set_width(impl->info_set, width);
    mpp_frame_set_height(impl->info_set, height);
    mpp_frame_set_fmt(impl->info_set, fmt);
    info_set_ptr = use_legacy_align ? &legacy_info_set : &sys_cfg_info_set;
    mpp_frame_set_hor_stride(impl->info_set, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(impl->info_set, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(impl->info_set, info_set_ptr->h_stride_by_pixel);
    mpp_frame_set_buf_size(impl->info_set, info_set_ptr->size_total);
    mpp_frame_set_buf_size(frame, info_set_ptr->size_total);
    mpp_frame_set_hor_stride(frame, info_set_ptr->h_stride_by_byte);
    mpp_frame_set_ver_stride(frame, info_set_ptr->v_stride);
    mpp_frame_set_hor_stride_pixel(frame, info_set_ptr->h_stride_by_pixel);
    impl->buf_size = info_set_ptr->size_total;

    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_MIXED) {
        /*
         * The decode hw only support 1/2 scaling in width and height,
         * downscale output image only support raster mode with 8bit depth.
         */
        RK_U32 down_scale_ver = MPP_ALIGN(mpp_frame_get_height(frame) >> 1, 16);
        RK_U32 down_scale_hor = MPP_ALIGN(mpp_frame_get_width(frame) >> 1, 16);
        RK_U32 downscale_buf_size;
        RK_U32 down_scale_y_virstride = down_scale_ver * down_scale_hor;

        switch ((fmt & MPP_FRAME_FMT_MASK)) {
        case MPP_FMT_YUV400 : {
            downscale_buf_size = down_scale_y_virstride;
        } break;
        case MPP_FMT_YUV420SP_10BIT :
        case MPP_FMT_YUV420SP : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP_10BIT :
        case MPP_FMT_YUV422SP : {
            downscale_buf_size = down_scale_y_virstride * 2;
        } break;
        case MPP_FMT_YUV444SP_10BIT :
        case MPP_FMT_YUV444SP : {
            downscale_buf_size = down_scale_y_virstride * 3;
        } break;
        default : {
            downscale_buf_size = down_scale_y_virstride * 3 / 2;
        } break;
        }
        downscale_buf_size = MPP_ALIGN(downscale_buf_size, 16);
        impl->buf_size += downscale_buf_size;
        mpp_frame_set_buf_size(impl->info_set, impl->buf_size);
        mpp_frame_set_buf_size(frame, impl->buf_size);
    }
    info_set_impl = (MppFrameImpl *)impl->info_set;
    frame_impl    = (MppFrameImpl *)frame;
    info_set_impl->color_range      = frame_impl->color_range;
    info_set_impl->color_primaries  = frame_impl->color_primaries;
    info_set_impl->color_trc        = frame_impl->color_trc;
    info_set_impl->colorspace       = frame_impl->colorspace;
    info_set_impl->chroma_location  = frame_impl->chroma_location;

    if (impl->align_chk_log_en) {
        impl->align_chk_log_en = 0;
        if (legacy_info_set.h_stride_by_pixel != sys_cfg_info_set.h_stride_by_pixel)
            mpp_logi("mismatch h_stride_by_pixel %d - %d\n",
                     legacy_info_set.h_stride_by_pixel,
                     sys_cfg_info_set.h_stride_by_pixel);
        if (legacy_info_set.h_stride_by_byte != sys_cfg_info_set.h_stride_by_byte)
            mpp_logi("mismatch h_stride_by_byte %d - %d\n",
                     legacy_info_set.h_stride_by_byte,
                     sys_cfg_info_set.h_stride_by_byte);
        if (legacy_info_set.v_stride != sys_cfg_info_set.v_stride)
            mpp_logi("mismatch v_stride %d - %d\n",
                     legacy_info_set.v_stride,
                     sys_cfg_info_set.v_stride);
        if (legacy_info_set.size_total != sys_cfg_info_set.size_total)
            mpp_logi("mismatch size_total %d - %d\n",
                     legacy_info_set.size_total,
                     sys_cfg_info_set.size_total);
    }
}